

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O1

void __thiscall dtc::text_input_buffer::parse_error(text_input_buffer *this,char *msg)

{
  input_buffer *b;
  _Elt_pointer psVar1;
  
  psVar1 = (this->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar1 != (this->input_stack).c.
                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (psVar1 == (this->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar1 = (this->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    b = psVar1[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    parse_error(this,msg,b,b->cursor);
    return;
  }
  fprintf(_stderr,"Error: %s\n",msg);
  return;
}

Assistant:

void
text_input_buffer::parse_error(const char *msg)
{
	if (input_stack.empty())
	{
		fprintf(stderr, "Error: %s\n", msg);
		return;
	}
	input_buffer &b = *input_stack.top();
	parse_error(msg, b, b.cursor);
}